

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_well_known_types.pb.cc
# Opt level: O2

size_t __thiscall proto2_unittest::OneofWellKnownTypes::ByteSizeLong(OneofWellKnownTypes *this)

{
  uint uVar1;
  size_t sVar2;
  
  uVar1 = (this->field_0)._impl_._oneof_case_[0] - 1;
  if (uVar1 < 0x12) {
    sVar2 = google::protobuf::internal::WireFormatLite::MessageSize<google::protobuf::Message>
                      ((this->field_0)._impl_.oneof_field_.any_field_);
    sVar2 = sVar2 + *(long *)(&DAT_00f4d628 + (ulong)uVar1 * 8);
  }
  else {
    sVar2 = 0;
  }
  sVar2 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar2,&(this->field_0)._impl_._cached_size_);
  return sVar2;
}

Assistant:

::size_t OneofWellKnownTypes::ByteSizeLong() const {
  const OneofWellKnownTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.OneofWellKnownTypes)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  switch (this_.oneof_field_case()) {
    // .google.protobuf.Any any_field = 1;
    case kAnyField: {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.any_field_);
      break;
    }
    // .google.protobuf.Api api_field = 2;
    case kApiField: {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.api_field_);
      break;
    }
    // .google.protobuf.Duration duration_field = 3;
    case kDurationField: {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.duration_field_);
      break;
    }
    // .google.protobuf.Empty empty_field = 4;
    case kEmptyField: {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.empty_field_);
      break;
    }
    // .google.protobuf.FieldMask field_mask_field = 5;
    case kFieldMaskField: {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.field_mask_field_);
      break;
    }
    // .google.protobuf.SourceContext source_context_field = 6;
    case kSourceContextField: {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.source_context_field_);
      break;
    }
    // .google.protobuf.Struct struct_field = 7;
    case kStructField: {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.struct_field_);
      break;
    }
    // .google.protobuf.Timestamp timestamp_field = 8;
    case kTimestampField: {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.timestamp_field_);
      break;
    }
    // .google.protobuf.Type type_field = 9;
    case kTypeField: {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.type_field_);
      break;
    }
    // .google.protobuf.DoubleValue double_field = 10;
    case kDoubleField: {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.double_field_);
      break;
    }
    // .google.protobuf.FloatValue float_field = 11;
    case kFloatField: {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.float_field_);
      break;
    }
    // .google.protobuf.Int64Value int64_field = 12;
    case kInt64Field: {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.int64_field_);
      break;
    }
    // .google.protobuf.UInt64Value uint64_field = 13;
    case kUint64Field: {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.uint64_field_);
      break;
    }
    // .google.protobuf.Int32Value int32_field = 14;
    case kInt32Field: {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.int32_field_);
      break;
    }
    // .google.protobuf.UInt32Value uint32_field = 15;
    case kUint32Field: {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.uint32_field_);
      break;
    }
    // .google.protobuf.BoolValue bool_field = 16;
    case kBoolField: {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.bool_field_);
      break;
    }
    // .google.protobuf.StringValue string_field = 17;
    case kStringField: {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.string_field_);
      break;
    }
    // .google.protobuf.BytesValue bytes_field = 18;
    case kBytesField: {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.bytes_field_);
      break;
    }
    case ONEOF_FIELD_NOT_SET: {
      break;
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}